

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O1

ssize_t __thiscall vox::LAYR::write(LAYR *this,int __fd,void *__buf,size_t __n)

{
  size_t sVar1;
  size_t sVar2;
  FILE *__n_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  FILE *__s;
  int32_t id;
  size_t childSize;
  size_t contentSize;
  undefined4 local_2c;
  undefined8 local_28;
  long local_20;
  
  __s = (FILE *)CONCAT44(in_register_00000034,__fd);
  local_2c = 0x5259414c;
  fwrite(&local_2c,4,1,__s);
  sVar1 = DICT::getSize(&this->nodeAttribs);
  local_20 = sVar1 + 8;
  fwrite(&local_20,4,1,__s);
  local_28 = 0;
  fwrite(&local_28,4,1,__s);
  __n_00 = __s;
  fwrite(this,4,1,__s);
  DICT::write(&this->nodeAttribs,__fd,__buf_00,(size_t)__n_00);
  sVar2 = fwrite(&this->reservedId,4,1,__s);
  return sVar2;
}

Assistant:

void LAYR::write(FILE* fp) {
    // chunk header
    int32_t id = GetMVID('L', 'A', 'Y', 'R');
    fwrite(&id, sizeof(int32_t), 1, fp);
    size_t contentSize = getSize();
    fwrite(&contentSize, sizeof(int32_t), 1, fp);
    size_t childSize = 0;
    fwrite(&childSize, sizeof(int32_t), 1, fp);

    // datas's
    fwrite(&nodeId, sizeof(int32_t), 1, fp);
    nodeAttribs.write(fp);
    fwrite(&reservedId, sizeof(int32_t), 1, fp);
}